

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O2

void nn_ctcp_destroy(nn_epbase *self)

{
  if (self != (nn_epbase *)0x0) {
    self = (nn_epbase *)(self + -6);
  }
  nn_dns_term((nn_dns *)&(((nn_fsm *)((long)self + 0x790))->stopped).src);
  nn_stcp_term((nn_stcp *)&((nn_fsm *)((long)self + 0x3c8))->state);
  nn_backoff_term((nn_backoff *)&((nn_fsm *)((long)self + 0x2c0))->owner);
  nn_usock_term((nn_usock *)&((nn_fsm *)((long)self + 0x58))->srcptr);
  nn_fsm_term((nn_fsm *)self);
  nn_epbase_term((nn_epbase *)&((nn_fsm *)((long)self + 0x58))->shutdown_fn);
  nn_free(self);
  return;
}

Assistant:

static void nn_ctcp_destroy (struct nn_epbase *self)
{
    struct nn_ctcp *ctcp;

    ctcp = nn_cont (self, struct nn_ctcp, epbase);

    nn_dns_term (&ctcp->dns);
    nn_stcp_term (&ctcp->stcp);
    nn_backoff_term (&ctcp->retry);
    nn_usock_term (&ctcp->usock);
    nn_fsm_term (&ctcp->fsm);
    nn_epbase_term (&ctcp->epbase);

    nn_free (ctcp);
}